

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long>::operator()
          (make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long> *this,
          stringstream *msg,char *arg,unsigned_long args,char *args_1,unsigned_long args_2)

{
  make_exception<unsigned_long,_const_char_*,_unsigned_long> local_39;
  unsigned_long local_38;
  unsigned_long args_local_2;
  char *args_local_1;
  unsigned_long args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long> *this_local;
  
  local_38 = args_2;
  args_local_2 = (unsigned_long)args_1;
  args_local_1 = (char *)args;
  args_local = (unsigned_long)arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<unsigned_long,_const_char_*,_unsigned_long>::operator()
            (&local_39,(stringstream *)arg_local,(unsigned_long)args_local_1,(char *)args_local_2,
             local_38);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }